

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.hpp
# Opt level: O2

bool __thiscall Quad::intersect(Quad *this,Ray *ray,float *result)

{
  bool bVar1;
  float t;
  point pVar2;
  
  t = -(ray->origin).y / (ray->dir).y;
  pVar2 = Ray::atParam(ray,t);
  if (t <= 0.0) {
    bVar1 = false;
  }
  else {
    bVar1 = false;
    if ((ABS(pVar2.x) < 0.5) && (bVar1 = false, ABS(pVar2.z) < 0.5)) {
      *result = t;
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool intersect(const Ray& ray, float& result) const
	{
		float t = -ray.origin.y / ray.dir.y;
		point p = ray.atParam(t);
		if (t>0 && p.x>-0.5 && p.x<0.5 && p.z>-0.5 && p.z<0.5)
		{
			result = t;
			return true;
		}
		return false;
	}